

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

bool absl::anon_unknown_0::EiselLemire<double>
               (ParsedFloat *input,bool negative,double *value,errc *ec)

{
  int iVar1;
  type_conflict1 tVar2;
  unsigned_long uVar3;
  uint64_t uVar4;
  unsigned_long uVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t extraout_RDX_03;
  uint64_t extraout_RDX_04;
  double dVar8;
  double dVar9;
  uint128 v;
  uint128 v_00;
  uint128 v_01;
  uint128 v_02;
  uint128 v_03;
  uint128 v_04;
  double local_190;
  float local_184;
  ulong local_180;
  uint64_t ret_bits;
  uint64_t local_170;
  uint64_t local_168;
  uint64_t local_160;
  absl *local_158;
  uint64_t local_150;
  ulong local_140;
  uint64_t ret_man;
  uint64_t local_130;
  ulong local_120;
  uint64_t msb;
  uint64_t local_110;
  uint64_t local_108;
  uint64_t local_100;
  absl *local_f8;
  uint64_t local_f0;
  absl *local_e8;
  uint64_t local_e0;
  uint128 local_d8;
  uint128 local_c8;
  uint128 local_b8;
  undefined1 local_a8 [8];
  uint128 y;
  uint128 local_78;
  uint128 local_68;
  undefined1 local_58 [8];
  uint128 x;
  uint64_t ret_exp2;
  int clz;
  int exp10;
  uint64_t man;
  errc *ec_local;
  double *value_local;
  bool negative_local;
  ParsedFloat *input_local;
  uint64_t extraout_RDX;
  
  uVar3 = input->mantissa;
  iVar1 = input->exponent;
  if (iVar1 < -0x156) {
    local_184 = -0.0;
    if (!negative) {
      local_184 = 0.0;
    }
    *value = (double)local_184;
    *ec = result_out_of_range;
    input_local._7_1_ = true;
  }
  else if (iVar1 < 0x135) {
    tVar2 = countl_zero<unsigned_long>(uVar3);
    uVar3 = uVar3 << ((byte)tVar2 & 0x3f);
    x.hi_ = (uint64_t)(((iVar1 * 0x3526a >> 0x10) + 0x43f) - tVar2);
    uint128::uint128(&local_68,uVar3);
    uint128::uint128(&local_78,
                     *(unsigned_long *)
                      ((anonymous_namespace)::kPower10MantissaHighTable + (long)(iVar1 + 0x156) * 8)
                    );
    _local_58 = absl::operator*(local_68,local_78);
    v.hi_ = local_58._8_8_;
    v.lo_ = v.hi_;
    uVar4 = Uint128High64((absl *)local_58,v);
    uVar6 = extraout_RDX;
    if ((uVar4 & 0x1ff) == 0x1ff) {
      uVar5 = std::numeric_limits<unsigned_long>::max();
      y.hi_ = (uint64_t)local_58;
      uVar6 = Uint128Low64(_local_58);
      if (uVar5 - uVar6 < uVar3) {
        uint128::uint128(&local_b8,uVar3);
        uint128::uint128(&local_c8,
                         *(unsigned_long *)
                          ((anonymous_namespace)::kPower10MantissaLowTable +
                          (long)(iVar1 + 0x156) * 8));
        _local_a8 = absl::operator*(local_b8,local_c8);
        v_00.hi_ = local_a8._8_8_;
        local_e8 = (absl *)local_a8;
        v_00.lo_ = v_00.hi_;
        local_e0 = v_00.hi_;
        uVar6 = Uint128High64((absl *)local_a8,v_00);
        uint128::uint128(&local_d8,uVar6);
        uint128::operator+=((uint128 *)local_58,local_d8);
        local_f8 = (absl *)local_58;
        local_f0 = x.lo_;
        v_01.hi_ = extraout_RDX_00;
        v_01.lo_ = x.lo_;
        uVar4 = Uint128High64((absl *)local_58,v_01);
        uVar6 = extraout_RDX_01;
        if ((uVar4 & 0x1ff) == 0x1ff) {
          local_108 = (uint64_t)local_58;
          local_100 = x.lo_;
          uVar4 = Uint128Low64(_local_58);
          uVar6 = extraout_RDX_02;
          if (uVar4 == 0xffffffffffffffff) {
            uVar5 = std::numeric_limits<unsigned_long>::max();
            msb = (uint64_t)local_a8;
            local_110 = y.lo_;
            uVar6 = Uint128Low64(_local_a8);
            if (uVar5 - uVar6 < uVar3) {
              return false;
            }
          }
        }
      }
    }
    ret_man = (uint64_t)local_58;
    local_130 = x.lo_;
    v_02.hi_ = uVar6;
    v_02.lo_ = x.lo_;
    uVar6 = Uint128High64((absl *)local_58,v_02);
    local_120 = uVar6 >> 0x3f;
    local_158 = (absl *)local_58;
    local_150 = x.lo_;
    v_03.hi_ = extraout_RDX_03;
    v_03.lo_ = x.lo_;
    uVar6 = Uint128High64((absl *)local_58,v_03);
    local_140 = uVar6 >> ((char)local_120 + 9U & 0x3f);
    x.hi_ = x.hi_ - (local_120 ^ 1);
    local_168 = (uint64_t)local_58;
    local_160 = x.lo_;
    uVar6 = Uint128Low64(_local_58);
    if (uVar6 == 0) {
      ret_bits = (uint64_t)local_58;
      local_170 = x.lo_;
      v_04.hi_ = extraout_RDX_04;
      v_04.lo_ = x.lo_;
      uVar6 = Uint128High64((absl *)local_58,v_04);
      if (((uVar6 & 0x1ff) == 0) && ((local_140 & 3) == 1)) {
        return false;
      }
    }
    uVar7 = (local_140 & 1) + local_140;
    local_140 = uVar7 >> 1;
    if (uVar7 >> 0x36 != 0) {
      x.hi_ = x.hi_ + 1;
    }
    if (x.hi_ - 1 < 0x7fe) {
      local_180 = x.hi_ << 0x34 | local_140 & 0xfffffffffffff;
      if (negative) {
        local_180 = local_180 | 0x8000000000000000;
      }
      dVar8 = bit_cast<double,_unsigned_long,_0>(&local_180);
      *value = dVar8;
      input_local._7_1_ = true;
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    dVar8 = std::numeric_limits<double>::max();
    dVar9 = std::numeric_limits<double>::max();
    local_190 = -dVar8;
    if (!negative) {
      local_190 = dVar9;
    }
    *value = local_190;
    *ec = result_out_of_range;
    input_local._7_1_ = true;
  }
  return input_local._7_1_;
}

Assistant:

bool EiselLemire(const strings_internal::ParsedFloat& input, bool negative,
                 FloatType* absl_nonnull value, std::errc* absl_nonnull ec) {
  uint64_t man = input.mantissa;
  int exp10 = input.exponent;
  if (exp10 < FloatTraits<FloatType>::kEiselLemireMinInclusiveExp10) {
    *value = negative ? -0.0f : 0.0f;
    *ec = std::errc::result_out_of_range;
    return true;
  } else if (exp10 >= FloatTraits<FloatType>::kEiselLemireMaxExclusiveExp10) {
    // Return max (a finite value) consistent with from_chars and DR 3081. For
    // SimpleAtod and SimpleAtof, post-processing will return infinity.
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    *ec = std::errc::result_out_of_range;
    return true;
  }

  // Assert kPower10TableMinInclusive <= exp10 < kPower10TableMaxExclusive.
  // Equivalently, !Power10Underflow(exp10) and !Power10Overflow(exp10).
  static_assert(
      FloatTraits<FloatType>::kEiselLemireMinInclusiveExp10 >=
          kPower10TableMinInclusive,
      "(exp10-kPower10TableMinInclusive) in kPower10MantissaHighTable bounds");
  static_assert(
      FloatTraits<FloatType>::kEiselLemireMaxExclusiveExp10 <=
          kPower10TableMaxExclusive,
      "(exp10-kPower10TableMinInclusive) in kPower10MantissaHighTable bounds");

  // The terse (+) comments in this function body refer to sections of the
  // https://nigeltao.github.io/blog/2020/eisel-lemire.html blog post.
  //
  // That blog post discusses double precision (11 exponent bits with a -1023
  // bias, 52 mantissa bits), but the same approach applies to single precision
  // (8 exponent bits with a -127 bias, 23 mantissa bits). Either way, the
  // computation here happens with 64-bit values (e.g. man) or 128-bit values
  // (e.g. x) before finally converting to 64- or 32-bit floating point.
  //
  // See also "Number Parsing at a Gigabyte per Second, Software: Practice and
  // Experience 51 (8), 2021" (https://arxiv.org/abs/2101.11408) for detail.

  // (+) Normalization.
  int clz = countl_zero(man);
  man <<= static_cast<unsigned int>(clz);
  // The 217706 etc magic numbers are from the Power10Exponent function.
  uint64_t ret_exp2 =
      static_cast<uint64_t>((217706 * exp10 >> 16) + 64 +
                            FloatTraits<FloatType>::kExponentBias - clz);

  // (+) Multiplication.
  uint128 x = static_cast<uint128>(man) *
              static_cast<uint128>(
                  kPower10MantissaHighTable[exp10 - kPower10TableMinInclusive]);

  // (+) Wider Approximation.
  static constexpr uint64_t high64_mask =
      FloatTraits<FloatType>::kEiselLemireMask;
  if (((Uint128High64(x) & high64_mask) == high64_mask) &&
      (man > (std::numeric_limits<uint64_t>::max() - Uint128Low64(x)))) {
    uint128 y =
        static_cast<uint128>(man) *
        static_cast<uint128>(
            kPower10MantissaLowTable[exp10 - kPower10TableMinInclusive]);
    x += Uint128High64(y);
    // For example, parsing "4503599627370497.5" will take the if-true
    // branch here (for double precision), since:
    //  - x   = 0x8000000000000BFF_FFFFFFFFFFFFFFFF
    //  - y   = 0x8000000000000BFF_7FFFFFFFFFFFF400
    //  - man = 0xA000000000000F00
    // Likewise, when parsing "0.0625" for single precision:
    //  - x   = 0x7FFFFFFFFFFFFFFF_FFFFFFFFFFFFFFFF
    //  - y   = 0x813FFFFFFFFFFFFF_8A00000000000000
    //  - man = 0x9C40000000000000
    if (((Uint128High64(x) & high64_mask) == high64_mask) &&
        ((Uint128Low64(x) + 1) == 0) &&
        (man > (std::numeric_limits<uint64_t>::max() - Uint128Low64(y)))) {
      return false;
    }
  }

  // (+) Shifting to 54 Bits (or for single precision, to 25 bits).
  uint64_t msb = Uint128High64(x) >> 63;
  uint64_t ret_man =
      Uint128High64(x) >> (msb + FloatTraits<FloatType>::kEiselLemireShift);
  ret_exp2 -= 1 ^ msb;

  // (+) Half-way Ambiguity.
  //
  // For example, parsing "1e+23" will take the if-true branch here (for double
  // precision), since:
  //  - x       = 0x54B40B1F852BDA00_0000000000000000
  //  - ret_man = 0x002A5A058FC295ED
  // Likewise, when parsing "20040229.0" for single precision:
  //  - x       = 0x4C72894000000000_0000000000000000
  //  - ret_man = 0x000000000131CA25
  if ((Uint128Low64(x) == 0) && ((Uint128High64(x) & high64_mask) == 0) &&
      ((ret_man & 3) == 1)) {
    return false;
  }

  // (+) From 54 to 53 Bits (or for single precision, from 25 to 24 bits).
  ret_man += ret_man & 1;  // Line From54a.
  ret_man >>= 1;           // Line From54b.
  // Incrementing ret_man (at line From54a) may have overflowed 54 bits (53
  // bits after the right shift by 1 at line From54b), so adjust for that.
  //
  // For example, parsing "9223372036854775807" will take the if-true branch
  // here (for double precision), since:
  //  - ret_man = 0x0020000000000000 = (1 << 53)
  // Likewise, when parsing "2147483647.0" for single precision:
  //  - ret_man = 0x0000000001000000 = (1 << 24)
  if ((ret_man >> FloatTraits<FloatType>::kTargetMantissaBits) > 0) {
    ret_exp2 += 1;
    // Conceptually, we need a "ret_man >>= 1" in this if-block to balance
    // incrementing ret_exp2 in the line immediately above. However, we only
    // get here when line From54a overflowed (after adding a 1), so ret_man
    // here is (1 << 53). Its low 53 bits are therefore all zeroes. The only
    // remaining use of ret_man is to mask it with ((1 << 52) - 1), so only its
    // low 52 bits matter. A "ret_man >>= 1" would have no effect in practice.
    //
    // We omit the "ret_man >>= 1", even if it is cheap (and this if-branch is
    // rarely taken) and technically 'more correct', so that mutation tests
    // that would otherwise modify or omit that "ret_man >>= 1" don't complain
    // that such code mutations have no observable effect.
  }

  // ret_exp2 is a uint64_t. Zero or underflow means that we're in subnormal
  // space. max_exp2 (0x7FF for double precision, 0xFF for single precision) or
  // above means that we're in Inf/NaN space.
  //
  // The if block is equivalent to (but has fewer branches than):
  //   if ((ret_exp2 <= 0) || (ret_exp2 >= max_exp2)) { etc }
  //
  // For example, parsing "4.9406564584124654e-324" will take the if-true
  // branch here, since ret_exp2 = -51.
  static constexpr uint64_t max_exp2 =
      (1 << FloatTraits<FloatType>::kTargetExponentBits) - 1;
  if ((ret_exp2 - 1) >= (max_exp2 - 1)) {
    return false;
  }

#ifndef ABSL_BIT_PACK_FLOATS
  if (FloatTraits<FloatType>::kTargetBits == 64) {
    *value = FloatTraits<FloatType>::Make(
        (ret_man & 0x000FFFFFFFFFFFFFu) | 0x0010000000000000u,
        static_cast<int>(ret_exp2) - 1023 - 52, negative);
    return true;
  } else if (FloatTraits<FloatType>::kTargetBits == 32) {
    *value = FloatTraits<FloatType>::Make(
        (static_cast<uint32_t>(ret_man) & 0x007FFFFFu) | 0x00800000u,
        static_cast<int>(ret_exp2) - 127 - 23, negative);
    return true;
  }
#else
  if (FloatTraits<FloatType>::kTargetBits == 64) {
    uint64_t ret_bits = (ret_exp2 << 52) | (ret_man & 0x000FFFFFFFFFFFFFu);
    if (negative) {
      ret_bits |= 0x8000000000000000u;
    }
    *value = static_cast<FloatType>(absl::bit_cast<double>(ret_bits));
    return true;
  } else if (FloatTraits<FloatType>::kTargetBits == 32) {
    uint32_t ret_bits = (static_cast<uint32_t>(ret_exp2) << 23) |
                        (static_cast<uint32_t>(ret_man) & 0x007FFFFFu);
    if (negative) {
      ret_bits |= 0x80000000u;
    }
    *value = static_cast<FloatType>(absl::bit_cast<float>(ret_bits));
    return true;
  }
#endif  // ABSL_BIT_PACK_FLOATS
  return false;
}